

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int ipv4_from_asc(uint8_t *v4,char *in)

{
  int iVar1;
  char *local_20;
  char *in_local;
  uint8_t *v4_local;
  
  local_20 = in;
  in_local = (char *)v4;
  iVar1 = get_ipv4_component(v4,&local_20);
  if (((((iVar1 != 0) && (iVar1 = get_ipv4_dot(&local_20), iVar1 != 0)) &&
       (iVar1 = get_ipv4_component((uint8_t *)(in_local + 1),&local_20), iVar1 != 0)) &&
      ((iVar1 = get_ipv4_dot(&local_20), iVar1 != 0 &&
       (iVar1 = get_ipv4_component((uint8_t *)(in_local + 2),&local_20), iVar1 != 0)))) &&
     ((iVar1 = get_ipv4_dot(&local_20), iVar1 != 0 &&
      ((iVar1 = get_ipv4_component((uint8_t *)(in_local + 3),&local_20), iVar1 != 0 &&
       (*local_20 == '\0')))))) {
    return 1;
  }
  return 0;
}

Assistant:

static int ipv4_from_asc(uint8_t v4[4], const char *in) {
  if (!get_ipv4_component(&v4[0], &in) || !get_ipv4_dot(&in) ||
      !get_ipv4_component(&v4[1], &in) || !get_ipv4_dot(&in) ||
      !get_ipv4_component(&v4[2], &in) || !get_ipv4_dot(&in) ||
      !get_ipv4_component(&v4[3], &in) || *in != '\0') {
    return 0;
  }
  return 1;
}